

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcSymbol * __thiscall
CTcPrsSymtab::find_or_def
          (CTcPrsSymtab *this,textchar_t *sym,size_t len,int copy_str,tcprs_undef_action action)

{
  byte *pbVar1;
  undefined1 *puVar2;
  tctarg_prop_id_t prop;
  int iVar3;
  undefined4 extraout_var;
  CTcSymProp *this_00;
  textchar_t *siz;
  size_t siz_00;
  CTcPrsSymtab *tab;
  CTcSymbol *pCVar4;
  
  while( true ) {
    do {
      tab = this;
      siz = sym;
      iVar3 = (*tab->_vptr_CTcPrsSymtab[2])(tab,sym,len);
      pCVar4 = (CTcSymbol *)CONCAT44(extraout_var,iVar3);
      if (pCVar4 != (CTcSymbol *)0x0) {
        (*(pCVar4->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
          [0xf])(pCVar4);
        if (1 < action - TCPRS_UNDEF_ADD_PROP) {
          return pCVar4;
        }
        if (*(int *)&(pCVar4->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                     field_0x24 != 3) {
          return pCVar4;
        }
        pbVar1 = (byte *)((long)&pCVar4[1].super_CTcSymbolBase.super_CVmHashEntryCS.
                                 super_CVmHashEntry._vptr_CVmHashEntry + 2);
        *pbVar1 = *pbVar1 & 0xfb;
        return pCVar4;
      }
      this = tab->parent_;
    } while (this != (CTcPrsSymtab *)0x0);
    if (action - TCPRS_UNDEF_ADD_PROP < 3) break;
    if (action == TCPRS_UNDEF_ADD_UNDEF) {
      siz_00 = len & 0xffffffff;
      CTcTokenizer::log_error(0x2b18,siz_00,sym);
      this_00 = (CTcSymProp *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x28,siz_00);
      CTcSymUndef::CTcSymUndef((CTcSymUndef *)this_00,sym,len,copy_str);
LAB_001ff210:
      add_to_global_symtab(tab,(CTcSymbol *)this_00);
      return (CTcSymbol *)this_00;
    }
  }
  this_00 = (CTcSymProp *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)siz);
  prop = G_cg->next_prop_;
  G_cg->next_prop_ = prop + 1;
  CTcSymProp::CTcSymProp(this_00,sym,len,copy_str,prop);
  if (action == TCPRS_UNDEF_ADD_PROP) {
    CTcTokenizer::log_warning(0x2b19,len & 0xffffffff,sym);
  }
  else if (action == TCPRS_UNDEF_ADD_PROP_WEAK) {
    puVar2 = &(this_00->super_CTcSymPropBase).field_0x2a;
    *puVar2 = *puVar2 | 4;
  }
  goto LAB_001ff210;
}

Assistant:

CTcSymbol *CTcPrsSymtab::find_or_def(const textchar_t *sym, size_t len,
                                     int copy_str, tcprs_undef_action action)
{
    /*
     *   Look for the symbol.  Start in the current symbol table, and work
     *   outwards to the outermost enclosing table. 
     */
    for (CTcPrsSymtab *curtab = this ; ; curtab = curtab->get_parent())
    {
        /* look for the symbol in this table */
        CTcSymbol *entry = (CTcSymbol *)curtab->find_direct(sym, len);
        if (entry != 0)
        {
            /* mark the entry as referenced */
            entry->mark_referenced();

            /* 
             *   if this is a non-weak property definition, and this is a
             *   property symbol, remove any existing weak flag from the
             *   property symbol 
             */
            if (entry->get_type() == TC_SYM_PROP
                && (action == TCPRS_UNDEF_ADD_PROP
                    || action == TCPRS_UNDEF_ADD_PROP_NO_WARNING))
                ((CTcSymProp *)entry)->set_weak(FALSE);

            /* found it - return the symbol */
            return entry;
        }

        /* 
         *   If there's no parent symbol table, the symbol is undefined.
         *   Add a new symbol according to the action parameter.  Note
         *   that we always add the new symbol at global scope, hence we
         *   add it to 'curtab', not 'this'.  
         */
        if (curtab->get_parent() == 0)
        {
            /* check which action we're being asked to perform */
            switch(action)
            {
            case TCPRS_UNDEF_ADD_UNDEF:
                /* add an "undefined" entry - log an error */
                G_tok->log_error(TCERR_UNDEF_SYM, (int)len, sym);

                /* create a new symbol of type undefined */
                entry = new CTcSymUndef(sym, len, copy_str);

                /* finish up */
                goto add_entry;

            case TCPRS_UNDEF_ADD_PROP:
            case TCPRS_UNDEF_ADD_PROP_NO_WARNING:
            case TCPRS_UNDEF_ADD_PROP_WEAK:
                {
                    /* create a new symbol of type property */
                    CTcSymProp *prop = new CTcSymProp(
                        sym, len, copy_str, G_cg->new_prop_id());

                    /* mark it as "weak" if desired */
                    if (action == TCPRS_UNDEF_ADD_PROP_WEAK)
                        prop->set_weak(TRUE);

                    /* use it as the new table entry */
                    entry = prop;
                }
                
                /* show a warning if desired */
                if (action == TCPRS_UNDEF_ADD_PROP)
                    G_tok->log_warning(TCERR_ASSUME_SYM_PROP, (int)len, sym);

                /* finish up */
                goto add_entry;

            add_entry:
                /* add the new entry to the global table */
                add_to_global_symtab(curtab, entry);

                /* return the new entry */
                return entry;
            }
        }
    }
}